

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * __thiscall
cmdline::parser::error_full_abi_cxx11_(string *__return_storage_ptr__,parser *this)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *this_00;
  ulong local_198;
  size_t i;
  ostringstream oss;
  parser *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  local_198 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->errors);
    if (sVar1 <= local_198) break;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->errors,local_198);
    this_00 = std::operator<<((ostream *)&i,(string *)pvVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_198 = local_198 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string error_full() const{
    std::ostringstream oss;
    for (size_t i=0; i<errors.size(); i++)
      oss<<errors[i]<<std::endl;
    return oss.str();
  }